

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

string * __thiscall
llbuild::buildsystem::BuildSystemInvocation::formatDetectedCycle_abi_cxx11_
          (string *__return_storage_ptr__,BuildSystemInvocation *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycle)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  undefined1 *puVar4;
  bool bVar5;
  Kind KVar6;
  raw_ostream *prVar7;
  size_t sVar8;
  long *plVar9;
  char *pcVar10;
  StringRef SVar11;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  BuildKey key;
  raw_svector_ostream os;
  SmallString<256U> message;
  BuildKey local_190;
  raw_ostream local_170;
  undefined1 **local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130 [256];
  
  local_140 = local_130;
  local_138 = 0x10000000000;
  local_170.BufferMode = InternalBuffer;
  local_170.OutBufStart = (char *)0x0;
  local_170.OutBufEnd = (char *)0x0;
  local_170.OutBufCur = (char *)0x0;
  local_170._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_0023fdc8;
  local_148 = &local_140;
  llvm::raw_ostream::SetUnbuffered(&local_170);
  SVar11.Length = 0x1f;
  SVar11.Data = "cycle detected while building: ";
  llvm::raw_ostream::operator<<(&local_170,SVar11);
  plVar9 = *(long **)this;
  plVar2 = (long *)(this->dbPath)._M_dataplus._M_p;
  if (plVar9 != plVar2) {
    bVar5 = true;
    do {
      lVar3 = *plVar9;
      if (!bVar5) {
        Str.Length = 4;
        Str.Data = " -> ";
        llvm::raw_ostream::operator<<(&local_170,Str);
      }
      BuildKey::fromData(&local_190,(KeyType *)(lVar3 + 8));
      KVar6 = BuildKey::kindForIdentifier(*local_190.key.key._M_dataplus._M_p);
      switch(KVar6) {
      case Command:
        Str_00.Length = 9;
        Str_00.Data = "command \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_00);
        SVar11 = BuildKey::getCommandName(&local_190);
        break;
      case CustomTask:
        Str_04.Length = 0xd;
        Str_04.Data = "custom task \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_04);
        SVar11 = BuildKey::getCustomTaskName(&local_190);
        break;
      case DirectoryContents:
        Str_02.Length = 0x14;
        Str_02.Data = "directory-contents \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_02);
        SVar11 = BuildKey::getDirectoryPath(&local_190);
        break;
      case FilteredDirectoryContents:
        sVar8 = 0x1d;
        pcVar10 = "filtered-directory-contents \'";
        goto LAB_001aa1ab;
      case DirectoryTreeSignature:
        Str_01.Length = 0x1a;
        Str_01.Data = "directory-tree-signature \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_01);
        SVar11 = BuildKey::getDirectoryTreeSignaturePath(&local_190);
        break;
      case DirectoryTreeStructureSignature:
        sVar8 = 0x24;
        pcVar10 = "directory-tree-structure-signature \'";
LAB_001aa1ab:
        Str_05.Length = sVar8;
        Str_05.Data = pcVar10;
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_05);
        SVar11 = BuildKey::getFilteredDirectoryPath(&local_190);
        break;
      case Node:
        Str_06.Length = 6;
        Str_06.Data = "node \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_06);
        SVar11 = BuildKey::getNodeName(&local_190);
        break;
      case Stat:
        Str_03.Length = 6;
        Str_03.Data = "stat \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_03);
        SVar11 = BuildKey::getStatName(&local_190);
        break;
      case Target:
        Str_07.Length = 8;
        Str_07.Data = "target \'";
        prVar7 = llvm::raw_ostream::operator<<(&local_170,Str_07);
        SVar11 = BuildKey::getTargetName(&local_190);
        break;
      case Unknown:
        sVar8 = 0xb;
        pcVar10 = "((unknown))";
        prVar7 = &local_170;
        goto LAB_001aa217;
      default:
        goto switchD_001aa0c4_default;
      }
      prVar7 = llvm::raw_ostream::operator<<(prVar7,SVar11);
      sVar8 = 1;
      pcVar10 = "\'";
LAB_001aa217:
      Str_08.Length = sVar8;
      Str_08.Data = pcVar10;
      llvm::raw_ostream::operator<<(prVar7,Str_08);
switchD_001aa0c4_default:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.key.key._M_dataplus._M_p != &local_190.key.key.field_2) {
        operator_delete(local_190.key.key._M_dataplus._M_p,
                        local_190.key.key.field_2._M_allocated_capacity + 1);
      }
      plVar9 = plVar9 + 1;
      bVar5 = false;
    } while (plVar9 != plVar2);
  }
  puVar4 = *local_148;
  if (puVar4 == (undefined1 *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    uVar1 = *(uint *)(local_148 + 1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,puVar4,puVar4 + uVar1);
  }
  llvm::raw_ostream::~raw_ostream(&local_170);
  if (local_140 != local_130) {
    free(local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BuildSystemInvocation::formatDetectedCycle(const std::vector<core::Rule*>& cycle) {
  // Compute a description of the cycle path.
  SmallString<256> message;
  llvm::raw_svector_ostream os(message);
  os << "cycle detected while building: ";
  bool first = true;
  for (const auto* rule: cycle) {
    if (!first)
      os << " -> ";

    // Convert to a build key.
    auto key = BuildKey::fromData(rule->key);
    switch (key.getKind()) {
      case BuildKey::Kind::Unknown:
        os << "((unknown))";
        break;
      case BuildKey::Kind::Command:
        os << "command '" << key.getCommandName() << "'";
        break;
      case BuildKey::Kind::CustomTask:
        os << "custom task '" << key.getCustomTaskName() << "'";
        break;
      case BuildKey::Kind::DirectoryContents:
        os << "directory-contents '" << key.getDirectoryPath() << "'";
        break;
      case BuildKey::Kind::FilteredDirectoryContents:
        os << "filtered-directory-contents '"
        << key.getFilteredDirectoryPath() << "'";
        break;
      case BuildKey::Kind::DirectoryTreeSignature:
        os << "directory-tree-signature '"
        << key.getDirectoryTreeSignaturePath() << "'";
        break;
      case BuildKey::Kind::DirectoryTreeStructureSignature:
        os << "directory-tree-structure-signature '"
        << key.getFilteredDirectoryPath() << "'";
        break;
      case BuildKey::Kind::Node:
        os << "node '" << key.getNodeName() << "'";
        break;
      case BuildKey::Kind::Stat:
        os << "stat '" << key.getStatName() << "'";
        break;
      case BuildKey::Kind::Target:
        os << "target '" << key.getTargetName() << "'";
        break;
    }
    first = false;
  }

  return os.str().str();
}